

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O3

void __thiscall BigInt::BigInt(BigInt *this,string *value_and_sign)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cVar1 = *(value_and_sign->_M_dataplus)._M_p;
  if (cVar1 == '-') {
    std::__cxx11::string::substr((ulong)local_68,(ulong)value_and_sign);
  }
  else {
    if (cVar1 != '+') goto LAB_0010432e;
    std::__cxx11::string::substr((ulong)local_68,(ulong)value_and_sign);
  }
  std::__cxx11::string::operator=((string *)value_and_sign,(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
LAB_0010432e:
  if (value_and_sign->_M_string_length != 1) {
    lVar4 = 0;
    do {
      if ((value_and_sign->_M_dataplus)._M_p[lVar4] != '0') break;
      lVar4 = lVar4 + 1;
    } while (value_and_sign->_M_string_length - 1 != lVar4);
  }
  std::__cxx11::string::substr((ulong)local_68,(ulong)value_and_sign);
  std::__cxx11::string::operator=((string *)value_and_sign,(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  iVar3 = std::__cxx11::string::compare((char *)value_and_sign);
  pcVar2 = (value_and_sign->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + value_and_sign->_M_string_length);
  set_number(this,&local_48,iVar3 == 0 || cVar1 != '-');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

BigInt::BigInt(string value_and_sign) {
    bool positive;
    if (value_and_sign[0] == '-') {
        positive = false;
        value_and_sign = value_and_sign.substr(1);
    } else if (value_and_sign[0] == '+') {
        positive = true;
        value_and_sign = value_and_sign.substr(1);
    } else {
        positive = true;
    }
    int i = 0;
    while (i < value_and_sign.size() - 1) {
        if (value_and_sign[i] != '0') {
            break;
        }
        ++i;
    }
    value_and_sign = value_and_sign.substr(i);
    if (value_and_sign == "0") {
        positive = true;
    }
    //    printf("structor %s \n", value_and_sign.c_str());
    this->set_number(value_and_sign, positive);
}